

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O3

json_array_element_t * __thiscall Json::JsonArray::get(JsonArray *this,int index)

{
  pointer psVar1;
  JsonException *this_00;
  undefined8 uVar2;
  ulong uVar3;
  char unaff_BPL;
  pointer unaff_R15;
  string local_40;
  
  if (-1 < index) {
    psVar1 = (this->__lstJsonArray).
             super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->__lstJsonArray).
                  super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1;
    if (index < (int)(uVar3 >> 4)) {
      if ((ulong)((long)uVar3 >> 4) <= (ulong)(uint)index) {
        uVar2 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
        if (local_40._M_dataplus._M_p != unaff_R15) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if (unaff_BPL != '\0') {
          __cxa_free_exception();
        }
        _Unwind_Resume(uVar2);
      }
      return psVar1 + (uint)index;
    }
  }
  this_00 = (JsonException *)__cxa_allocate_exception(0x50);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Error: Invalid Index","");
  JsonException::JsonException(this_00,&local_40);
  __cxa_throw(this_00,&JsonException::typeinfo,JsonException::~JsonException);
}

Assistant:

const Json::JsonArray::json_array_element_t &Json::JsonArray::get(int index) {
    if (index < 0 || index >= size())throw JsonException("Error: Invalid Index");
    return __lstJsonArray.at(index);
}